

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviewer.cpp
# Opt level: O3

bool __thiscall GraphViewer::setEdgeDashed(GraphViewer *this,int k,bool dashed)

{
  Connection *this_00;
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  undefined7 in_register_00000011;
  string str;
  char buff [200];
  string local_128;
  long *local_108;
  long local_100;
  long local_f8 [2];
  char local_e8 [200];
  
  pcVar3 = "false";
  if ((int)CONCAT71(in_register_00000011,dashed) != 0) {
    pcVar3 = "true";
  }
  sprintf(local_e8,"setEdgeDashed %d %s\n",k,pcVar3);
  local_108 = local_f8;
  sVar2 = strlen(local_e8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,local_e8,local_e8 + sVar2);
  this_00 = this->con;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,local_108,local_100 + (long)local_108);
  bVar1 = Connection::sendMsg(this_00,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if (local_108 != local_f8) {
    operator_delete(local_108,local_f8[0] + 1);
  }
  return bVar1;
}

Assistant:

bool GraphViewer::setEdgeDashed(int k, bool dashed) {
	char buff[200];
	sprintf(buff, "setEdgeDashed %d %s\n", k, dashed? "true" : "false");
	string str(buff);
	return con->sendMsg(str);
}